

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O2

deUint32 tcu::colorDistSquared(deUint32 pa,deUint32 pb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (pa & 0xff) - (pb & 0xff);
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  if (uVar1 < 5) {
    uVar1 = 4;
  }
  uVar4 = (pa >> 8 & 0xff) - (pb >> 8 & 0xff);
  uVar2 = -uVar4;
  if (0 < (int)uVar4) {
    uVar2 = uVar4;
  }
  if (uVar2 < 5) {
    uVar2 = 4;
  }
  uVar5 = (pa >> 0x10 & 0xff) - (pb >> 0x10 & 0xff);
  uVar4 = -uVar5;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  if (uVar4 < 5) {
    uVar4 = 4;
  }
  uVar3 = (pa >> 0x18) - (pb >> 0x18);
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  if (uVar5 < 5) {
    uVar5 = 4;
  }
  return (uVar5 - 4) * (uVar5 - 4) + (uVar1 - 4) * (uVar1 - 4) +
         (uVar4 - 4) * (uVar4 - 4) + (uVar2 - 4) * (uVar2 - 4);
}

Assistant:

static inline deUint32 colorDistSquared (deUint32 pa, deUint32 pb)
{
	const int	r	= de::max<int>(de::abs((int)getChannel<0>(pa) - (int)getChannel<0>(pb)) - MIN_ERR_THRESHOLD, 0);
	const int	g	= de::max<int>(de::abs((int)getChannel<1>(pa) - (int)getChannel<1>(pb)) - MIN_ERR_THRESHOLD, 0);
	const int	b	= de::max<int>(de::abs((int)getChannel<2>(pa) - (int)getChannel<2>(pb)) - MIN_ERR_THRESHOLD, 0);
	const int	a	= de::max<int>(de::abs((int)getChannel<3>(pa) - (int)getChannel<3>(pb)) - MIN_ERR_THRESHOLD, 0);

	return deUint32(r*r + g*g + b*b + a*a);
}